

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *coScaleval,bool rowRatio)

{
  Real eps;
  type_conflict5 tVar1;
  double *pdVar2;
  soplex *psVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined4 *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  multiprecision *pmVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  long *plVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  cpp_dec_float<200U,_int,_void> local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  Tolerances *local_1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8 [15];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  multiprecision local_b0 [112];
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar20 = 0;
  uVar18 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  bVar19 = (int)coScaleval != 0;
  psVar3 = this + 0x100;
  if (bVar19) {
    psVar3 = this + 0x38;
  }
  lVar8 = 0xe8;
  if (bVar19) {
    lVar8 = 0x20;
  }
  lVar9 = 0xf0;
  if (bVar19) {
    lVar9 = 0x28;
  }
  uVar4 = (ulong)*(uint *)psVar3;
  if ((int)*(uint *)psVar3 < 1) {
    uVar4 = uVar18;
  }
  for (; uVar18 != uVar4; uVar18 = uVar18 + 1) {
    plVar16 = (long *)((long)*(int *)(*(long *)(this + lVar9) + 4 + uVar18 * 8) * 0x28 +
                      *(long *)(this + lVar8));
    pdVar2 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_2b0,*pdVar2,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_230,0.0,(type *)0x0);
    lVar10 = 0;
    for (lVar17 = 0; lVar17 < *(int *)((long)plVar16 + 0xc); lVar17 = lVar17 + 1) {
      lVar7 = *plVar16;
      lVar6 = 0x1c;
      puVar11 = (undefined4 *)(lVar7 + lVar10);
      pmVar13 = local_b0;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined4 *)pmVar13 = *puVar11;
        puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
        pmVar13 = pmVar13 + (ulong)bVar20 * -8 + 4;
      }
      local_40 = *(undefined4 *)(lVar7 + 0x70 + lVar10);
      local_3c = *(undefined1 *)(lVar7 + 0x74 + lVar10);
      local_38 = *(undefined8 *)(lVar7 + 0x78 + lVar10);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((type *)&local_1b0,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      p.m_backend.fpclass = cpp_dec_float_finite;
      p.m_backend.prec_elem = 0x1c;
      p.m_backend.data._M_elems[0] = 0;
      p.m_backend.data._M_elems[1] = 0;
      p.m_backend.data._M_elems[2] = 0;
      p.m_backend.data._M_elems[3] = 0;
      p.m_backend.data._M_elems[4] = 0;
      p.m_backend.data._M_elems[5] = 0;
      p.m_backend.data._M_elems[6] = 0;
      p.m_backend.data._M_elems[7] = 0;
      p.m_backend.data._M_elems[8] = 0;
      p.m_backend.data._M_elems[9] = 0;
      p.m_backend.data._M_elems[10] = 0;
      p.m_backend.data._M_elems[0xb] = 0;
      p.m_backend.data._M_elems[0xc] = 0;
      p.m_backend.data._M_elems[0xd] = 0;
      p.m_backend.data._M_elems[0xe] = 0;
      p.m_backend.data._M_elems[0xf] = 0;
      p.m_backend.data._M_elems[0x10] = 0;
      p.m_backend.data._M_elems[0x11] = 0;
      p.m_backend.data._M_elems[0x12] = 0;
      p.m_backend.data._M_elems[0x13] = 0;
      p.m_backend.data._M_elems[0x14] = 0;
      p.m_backend.data._M_elems[0x15] = 0;
      p.m_backend.data._M_elems[0x16] = 0;
      p.m_backend.data._M_elems[0x17] = 0;
      p.m_backend.data._M_elems[0x18] = 0;
      p.m_backend.data._M_elems[0x19] = 0;
      p.m_backend.data._M_elems._104_5_ = 0;
      p.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      p.m_backend.exp = 0;
      p.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&p.m_backend,(cpp_dec_float<200U,_int,_void> *)&local_1b0,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray + (ulong)*(uint *)(*plVar16 + 0x80 + lVar10) * 0x10));
      pcVar12 = &p.m_backend;
      pnVar15 = &local_130;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = p.m_backend.exp;
      local_130.m_backend.neg = p.m_backend.neg;
      local_130.m_backend.fpclass = p.m_backend.fpclass;
      local_130.m_backend.prec_elem = p.m_backend.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&local_1b0,
                 (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x228));
      eps = Tolerances::epsilon(local_1b0);
      bVar19 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_130,eps);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1a8);
      if (!bVar19) {
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&p.m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_2b0);
        if (tVar1) {
          pcVar12 = &p.m_backend;
          pcVar14 = &local_2b0;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar14 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_2b0.exp = p.m_backend.exp;
          local_2b0.neg = p.m_backend.neg;
          local_2b0.fpclass = p.m_backend.fpclass;
          local_2b0.prec_elem = p.m_backend.prec_elem;
        }
        tVar1 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&p.m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_230);
        if (tVar1) {
          pcVar12 = &p.m_backend;
          pcVar14 = &local_230;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar14 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_230.exp = p.m_backend.exp;
          local_230.neg = p.m_backend.neg;
          local_230.fpclass = p.m_backend.fpclass;
          local_230.prec_elem = p.m_backend.prec_elem;
        }
      }
      lVar10 = lVar10 + 0x84;
    }
    pdVar2 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&p.m_backend,*pdVar2,(type *)0x0);
    bVar19 = boost::multiprecision::operator==
                       ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_2b0,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&p.m_backend);
    if (!bVar19) {
      p.m_backend.fpclass = cpp_dec_float_finite;
      p.m_backend.prec_elem = 0x1c;
      p.m_backend.data._M_elems[0] = 0;
      p.m_backend.data._M_elems[1] = 0;
      p.m_backend.data._M_elems[2] = 0;
      p.m_backend.data._M_elems[3] = 0;
      p.m_backend.data._M_elems[4] = 0;
      p.m_backend.data._M_elems[5] = 0;
      p.m_backend.data._M_elems[6] = 0;
      p.m_backend.data._M_elems[7] = 0;
      p.m_backend.data._M_elems[8] = 0;
      p.m_backend.data._M_elems[9] = 0;
      p.m_backend.data._M_elems[10] = 0;
      p.m_backend.data._M_elems[0xb] = 0;
      p.m_backend.data._M_elems[0xc] = 0;
      p.m_backend.data._M_elems[0xd] = 0;
      p.m_backend.data._M_elems[0xe] = 0;
      p.m_backend.data._M_elems[0xf] = 0;
      p.m_backend.data._M_elems[0x10] = 0;
      p.m_backend.data._M_elems[0x11] = 0;
      p.m_backend.data._M_elems[0x12] = 0;
      p.m_backend.data._M_elems[0x13] = 0;
      p.m_backend.data._M_elems[0x14] = 0;
      p.m_backend.data._M_elems[0x15] = 0;
      p.m_backend.data._M_elems[0x16] = 0;
      p.m_backend.data._M_elems[0x17] = 0;
      p.m_backend.data._M_elems[0x18] = 0;
      p.m_backend.data._M_elems[0x19] = 0;
      p.m_backend.data._M_elems._104_5_ = 0;
      p.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      p.m_backend.exp = 0;
      p.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&p.m_backend,&local_230,&local_2b0);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&p.m_backend,__return_storage_ptr__);
      if (tVar1) {
        pcVar12 = &p.m_backend;
        pnVar15 = __return_storage_ptr__;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar20 * -8 + 4);
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        (__return_storage_ptr__->m_backend).exp = p.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = p.m_backend.neg;
        (__return_storage_ptr__->m_backend).fpclass = p.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = p.m_backend.prec_elem;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}